

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbwrapper.cpp
# Opt level: O2

void __thiscall CDBWrapper::~CDBWrapper(CDBWrapper *this)

{
  long lVar1;
  FilterPolicy *pFVar2;
  Logger *pLVar3;
  Cache *pCVar4;
  LevelDBContext *pLVar5;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pLVar5 = DBContext(this);
  if (pLVar5->pdb != (DB *)0x0) {
    (*pLVar5->pdb->_vptr_DB[1])();
  }
  pLVar5 = DBContext(this);
  pLVar5->pdb = (DB *)0x0;
  pLVar5 = DBContext(this);
  pFVar2 = (pLVar5->options).filter_policy;
  if (pFVar2 != (FilterPolicy *)0x0) {
    (*pFVar2->_vptr_FilterPolicy[1])();
  }
  pLVar5 = DBContext(this);
  (pLVar5->options).filter_policy = (FilterPolicy *)0x0;
  pLVar5 = DBContext(this);
  pLVar3 = (pLVar5->options).info_log;
  if (pLVar3 != (Logger *)0x0) {
    (*pLVar3->_vptr_Logger[1])();
  }
  pLVar5 = DBContext(this);
  (pLVar5->options).info_log = (Logger *)0x0;
  pLVar5 = DBContext(this);
  pCVar4 = (pLVar5->options).block_cache;
  if (pCVar4 != (Cache *)0x0) {
    (*pCVar4->_vptr_Cache[1])();
  }
  pLVar5 = DBContext(this);
  (pLVar5->options).block_cache = (Cache *)0x0;
  pLVar5 = DBContext(this);
  if (pLVar5->penv != (Env *)0x0) {
    (*pLVar5->penv->_vptr_Env[1])();
  }
  pLVar5 = DBContext(this);
  (pLVar5->options).env = (Env *)0x0;
  std::filesystem::__cxx11::path::~path(&(this->m_path).super_path);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&(this->obfuscate_key).
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::__cxx11::string::~string((string *)&this->m_name);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    std::unique_ptr<LevelDBContext,_std::default_delete<LevelDBContext>_>::~unique_ptr
              (&this->m_db_context);
    return;
  }
  __stack_chk_fail();
}

Assistant:

CDBWrapper::~CDBWrapper()
{
    delete DBContext().pdb;
    DBContext().pdb = nullptr;
    delete DBContext().options.filter_policy;
    DBContext().options.filter_policy = nullptr;
    delete DBContext().options.info_log;
    DBContext().options.info_log = nullptr;
    delete DBContext().options.block_cache;
    DBContext().options.block_cache = nullptr;
    delete DBContext().penv;
    DBContext().options.env = nullptr;
}